

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_waypoint_node.cpp
# Opt level: O3

void __thiscall random_waypoint_node::run(random_waypoint_node *this)

{
  vec3 *pvVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vec3 *pvVar8;
  long lVar9;
  long lVar10;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng_6;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar7 = ZMIN;
  dVar6 = YMIN;
  dVar5 = XMIN;
  dVar4 = VMAX;
  dVar3 = VMIN;
  dVar15 = ZMAX;
  dVar14 = YMAX;
  dVar13 = XMAX;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  dVar13 = dVar13 - dVar5;
  (this->super_node).x = dVar11 * dVar13 + dVar5;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  dVar14 = dVar14 - dVar6;
  (this->super_node).y = dVar11 * dVar14 + dVar6;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  dVar15 = dVar15 - dVar7;
  (this->super_node).z = dVar11 * dVar15 + dVar7;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  this->destx = dVar11 * dVar13 + dVar5;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  this->desty = dVar11 * dVar14 + dVar6;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  this->destz = dVar11 * dVar15 + dVar7;
  dVar11 = std::
           generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                     (&e);
  (this->super_node).v = dVar11 * (dVar4 - dVar3) + dVar3;
  dVar11 = atan2(this->desty - (this->super_node).y,this->destx - (this->super_node).x);
  (this->super_node).d = dVar11;
  dVar11 = this->destz - (this->super_node).z;
  dVar16 = this->desty - (this->super_node).y;
  dVar12 = this->destx - (this->super_node).x;
  dVar11 = acos(dVar11 / SQRT(dVar11 * dVar11 + dVar16 * dVar16 + dVar12 * dVar12));
  (this->super_node).p = dVar11;
  *(uint *)(usleep + *(long *)(std::cout + -0x18)) =
       *(uint *)(usleep + *(long *)(std::cout + -0x18)) | 4;
  std::chrono::_V2::system_clock::now();
  lVar9 = std::chrono::_V2::system_clock::now();
  std::chrono::_V2::system_clock::now();
  pvVar8 = points;
  dVar11 = (this->super_node).z;
  iVar2 = (this->super_node).id;
  dVar12 = (this->super_node).y;
  pvVar1 = points + iVar2;
  pvVar1->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(float)(this->super_node).x;
  pvVar1->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(float)dVar12;
  pvVar8[iVar2].field_2.z = (float)dVar11;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  if (running == true) {
    do {
      std::chrono::_V2::system_clock::now();
      lVar10 = std::chrono::_V2::system_clock::now();
      if ((this->super_node).first == true) {
        (this->super_node).first = false;
        lVar9 = lVar10;
      }
      update(this,((double)(lVar10 - lVar9) / 1000.0) / 1000000.0);
      lVar9 = std::chrono::_V2::system_clock::now();
      std::chrono::_V2::system_clock::now();
      if ((this->super_node).lastErr == 1) {
        dVar11 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        this->destx = dVar11 * dVar13 + dVar5;
        dVar11 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        this->desty = dVar11 * dVar14 + dVar6;
        dVar11 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        this->destz = dVar11 * dVar15 + dVar7;
        dVar11 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&e);
        node::setv(&this->super_node,dVar11 * (dVar4 - dVar3) + dVar3);
        dVar11 = atan2(this->desty - (this->super_node).y,this->destx - (this->super_node).x);
        node::setd(&this->super_node,dVar11);
        dVar11 = this->destz - (this->super_node).z;
        dVar16 = this->desty - (this->super_node).y;
        dVar12 = this->destx - (this->super_node).x;
        dVar11 = acos(dVar11 / SQRT(dVar11 * dVar11 + dVar16 * dVar16 + dVar12 * dVar12));
        node::setp(&this->super_node,dVar11);
        (this->super_node).lastErr = 0;
      }
      usleep(1000);
    } while (running != false);
  }
  return;
}

Assistant:

void random_waypoint_node::run(){
    uniform_real_distribution<double> randomX(XMIN,XMAX);
    uniform_real_distribution<double> randomY(YMIN,YMAX);
    uniform_real_distribution<double> randomZ(ZMIN,ZMAX);
    uniform_real_distribution<double> randomVel(VMIN,VMAX);
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    x = randomX(e);
    y = randomY(e);
    z = randomZ(e);
    destx = randomX(e);
    desty = randomY(e);
    destz = randomZ(e);
    v = randomVel(e);
    d = atan2(desty-y,destx-x);
    p = acos((destz-z)/(sqrt((desty-y)*(desty-y)+(destx-x)*(destx-x)+(destz -z)*(destz -z))));
    std::chrono::duration<double, std::micro> tmpTime;     //Time between current and lastshow
    std::chrono::duration<double, std::micro> loopTime;    //Time used for a single loop
    std::chrono::duration<double, std::micro> changeTime;
    std::chrono::duration<double, std::micro> wholeTime;
    high_resolution_clock::time_point loopEndTime;
    cout<<setiosflags(ios::fixed);
    high_resolution_clock::time_point baseTime = high_resolution_clock::now();
    high_resolution_clock::time_point lastChange = high_resolution_clock::now();    //Time when random_waypoint_node info changed
    high_resolution_clock::time_point  lastUpdate = lastChange;   //Time when random_waypoint_node loc updated
    high_resolution_clock::time_point lastShow = lastUpdate;    //Time when random_waypoint_node info shown
    high_resolution_clock::time_point currentTime = high_resolution_clock::now();
    wholeTime = currentTime-baseTime;
//    printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
    //initial output
    while(running == true){
        currentTime = high_resolution_clock::now();
        tmpTime = (currentTime-lastShow);
        loopEndTime = high_resolution_clock::now();
        if (first) {
            lastUpdate = loopEndTime;
            lastChange = loopEndTime;
            first = false;
        }
        loopTime=(loopEndTime-lastUpdate);
        this->update(loopTime.count()/1e6);
        lastUpdate = high_resolution_clock::now();
        currentTime = high_resolution_clock::now();
        changeTime = currentTime-lastChange;
        if(lastErr == 1){       //Regenerate random_waypoint_node info every $timeout second
            lastChange = currentTime;
            destx = randomX(e);
            desty = randomY(e);
            destz = randomZ(e);
            this->setv(randomVel(e));
            this->setd(atan2(desty-y,destx-x));
            this->setp(acos((destz-z)/(sqrt((desty-y)*(desty-y)+(destx-x)*(destx-x)+(destz -z)*(destz -z)))));
            lastErr = 0;                //To avoid random_waypoint_node bouncing near the edge
        }
        usleep(1000);
    }
}